

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong_conflict
helper_extr_w_mipsel
          (target_ulong_conflict ac,target_ulong_conflict shift,CPUMIPSState_conflict4 *env)

{
  long lVar1;
  ulong local_38;
  int64_t tempDL [2];
  int32_t tempI;
  CPUMIPSState_conflict4 *env_local;
  target_ulong_conflict shift_local;
  target_ulong_conflict ac_local;
  
  mipsdsp_rndrashift_short_acc((int64_t *)&local_38,ac,shift & 0x1f,env);
  if (((tempDL[0] != 0) || ((local_38 & 0xffffffff00000000) != 0)) &&
     ((tempDL[0] != 1 || ((local_38 & 0xffffffff00000000) != 0xffffffff00000000)))) {
    set_DSPControl_overflow_flag(1,0x17,env);
  }
  lVar1 = (long)local_38 >> 1;
  local_38 = local_38 + 1;
  if (local_38 == 0) {
    tempDL[0] = tempDL[0] + 1;
  }
  if ((((tempDL[0] & 1U) != 0) || ((local_38 & 0xffffffff00000000) != 0)) &&
     (((tempDL[0] & 1U) != 1 || ((local_38 & 0xffffffff00000000) != 0xffffffff00000000)))) {
    set_DSPControl_overflow_flag(1,0x17,env);
  }
  return (target_ulong_conflict)lVar1;
}

Assistant:

target_ulong helper_extr_w(target_ulong ac, target_ulong shift,
                           CPUMIPSState *env)
{
    int32_t tempI;
    int64_t tempDL[2];

    shift = shift & 0x1F;

    mipsdsp_rndrashift_short_acc(tempDL, ac, shift, env);
    if ((tempDL[1] != 0 || (tempDL[0] & MIPSDSP_LHI) != 0) &&
        (tempDL[1] != 1 || (tempDL[0] & MIPSDSP_LHI) != MIPSDSP_LHI)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    tempI = (tempDL[0] >> 1) & MIPSDSP_LLO;

    tempDL[0] += 1;
    if (tempDL[0] == 0) {
        tempDL[1] += 1;
    }

    if (((tempDL[1] & 0x01) != 0 || (tempDL[0] & MIPSDSP_LHI) != 0) &&
        ((tempDL[1] & 0x01) != 1 || (tempDL[0] & MIPSDSP_LHI) != MIPSDSP_LHI)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    return (target_long)tempI;
}